

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O1

MessageType __thiscall
google::protobuf::json_internal::ClassifyMessage(json_internal *this,string_view name)

{
  char *pcVar1;
  int iVar2;
  size_type __rlen;
  json_internal *__n;
  char *pcVar3;
  undefined1 auVar4 [16];
  
  pcVar3 = (char *)name._M_len;
  if (this < (json_internal *)0x10) {
    return kNotWellKnown;
  }
  auVar4[0] = -(*pcVar3 == 'g');
  auVar4[1] = -(pcVar3[1] == 'o');
  auVar4[2] = -(pcVar3[2] == 'o');
  auVar4[3] = -(pcVar3[3] == 'g');
  auVar4[4] = -(pcVar3[4] == 'l');
  auVar4[5] = -(pcVar3[5] == 'e');
  auVar4[6] = -(pcVar3[6] == '.');
  auVar4[7] = -(pcVar3[7] == 'p');
  auVar4[8] = -(pcVar3[8] == 'r');
  auVar4[9] = -(pcVar3[9] == 'o');
  auVar4[10] = -(pcVar3[10] == 't');
  auVar4[0xb] = -(pcVar3[0xb] == 'o');
  auVar4[0xc] = -(pcVar3[0xc] == 'b');
  auVar4[0xd] = -(pcVar3[0xd] == 'u');
  auVar4[0xe] = -(pcVar3[0xe] == 'f');
  auVar4[0xf] = -(pcVar3[0xf] == '.');
  if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf) !=
      0xffff) {
    return kNotWellKnown;
  }
  if ((json_internal *)0x8 < this + -0x13) {
    return kNotWellKnown;
  }
  __n = this + -0x10;
  pcVar3 = pcVar3 + 0x10;
  switch(this) {
  case (json_internal *)0x13:
    if ((__n == (json_internal *)0x3) && (iVar2 = bcmp(pcVar3,"Any",3), iVar2 == 0)) {
      return kAny;
    }
    break;
  case (json_internal *)0x15:
    if ((__n == (json_internal *)0x5) && (iVar2 = bcmp(pcVar3,"Value",5), iVar2 == 0)) {
      return kValue;
    }
    break;
  case (json_internal *)0x16:
    if ((__n == (json_internal *)&DAT_00000006) && (iVar2 = bcmp(pcVar3,"Struct",6), iVar2 == 0)) {
      return kStruct;
    }
    break;
  case (json_internal *)0x18:
    if ((__n == (json_internal *)0x8) && (iVar2 = bcmp(pcVar3,"Duration",8), iVar2 == 0)) {
      return kDuration;
    }
    break;
  case (json_internal *)0x19:
    if (__n == (json_internal *)0x9) {
      iVar2 = bcmp(pcVar3,"BoolValue",9);
      if (iVar2 == 0) {
        return kWrapper;
      }
      iVar2 = bcmp(pcVar3,"NullValue",9);
      if (iVar2 == 0) {
        return kNull;
      }
      iVar2 = bcmp(pcVar3,"ListValue",9);
      if (iVar2 == 0) {
        return kList;
      }
      iVar2 = bcmp(pcVar3,"Timestamp",9);
      if (iVar2 == 0) {
        return kTimestamp;
      }
      iVar2 = bcmp(pcVar3,"FieldMask",9);
      if (iVar2 == 0) {
        return kFieldMask;
      }
    }
    break;
  case (json_internal *)0x1a:
    if (__n != (json_internal *)0xa) {
      return kNotWellKnown;
    }
    iVar2 = bcmp(pcVar3,"BytesValue",10);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar3,"FloatValue",10);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar3,"Int32Value",10);
    if (iVar2 == 0) {
      return kWrapper;
    }
    pcVar1 = "google.protobuf.Int64Value";
    goto LAB_002cf8c0;
  case (json_internal *)0x1b:
    if (__n != (json_internal *)0xb) {
      return kNotWellKnown;
    }
    iVar2 = bcmp(pcVar3,"DoubleValue",0xb);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar3,"StringValue",0xb);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar3,"UInt32Value",0xb);
    if (iVar2 == 0) {
      return kWrapper;
    }
    pcVar1 = "google.protobuf.UInt64Value";
LAB_002cf8c0:
    iVar2 = bcmp(pcVar3,pcVar1 + 0x10,(size_t)__n);
    if (iVar2 == 0) {
      return kWrapper;
    }
  }
  return kNotWellKnown;
}

Assistant:

inline MessageType ClassifyMessage(absl::string_view name) {
  constexpr absl::string_view kWellKnownPkg = "google.protobuf.";
  if (!absl::StartsWith(name, kWellKnownPkg)) {
    return MessageType::kNotWellKnown;
  }
  name = name.substr(kWellKnownPkg.size());

  switch (name.size()) {
    case 3:
      if (name == "Any") {
        return MessageType::kAny;
      }
      break;
    case 5:
      if (name == "Value") {
        return MessageType::kValue;
      }
      break;
    case 6:
      if (name == "Struct") {
        return MessageType::kStruct;
      }
      break;
    case 8:
      if (name == "Duration") {
        return MessageType::kDuration;
      }
      break;
    case 9:
      if (name == "BoolValue") {
        return MessageType::kWrapper;
      }
      if (name == "NullValue") {
        return MessageType::kNull;
      }
      if (name == "ListValue") {
        return MessageType::kList;
      }
      if (name == "Timestamp") {
        return MessageType::kTimestamp;
      }
      if (name == "FieldMask") {
        return MessageType::kFieldMask;
      }
      break;
    case 10:
      if (name == "BytesValue" || name == "FloatValue" ||
          name == "Int32Value" || name == "Int64Value") {
        return MessageType::kWrapper;
      }
      break;
    case 11:
      if (name == "DoubleValue" || name == "StringValue" ||
          name == "UInt32Value" || name == "UInt64Value") {
        return MessageType::kWrapper;
      }
      break;
    default:
      break;
  }

  return MessageType::kNotWellKnown;
}